

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Chapters::~Chapters(Chapters *this)

{
  Chapter *pCVar1;
  long in_RDI;
  Chapter *chapter;
  Chapter *local_28;
  Chapter *in_stack_ffffffffffffffe0;
  Chapter *pCVar2;
  
  while (0 < *(int *)(in_RDI + 4)) {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + -1;
    Chapter::Clear(in_stack_ffffffffffffffe0);
  }
  pCVar2 = *(Chapter **)(in_RDI + 8);
  if (pCVar2 != (Chapter *)0x0) {
    pCVar1 = pCVar2 + -1;
    local_28 = pCVar2 + *(long *)&pCVar2[-1].displays_size_;
    if (pCVar2 != local_28) {
      do {
        local_28 = local_28 + -1;
        Chapter::~Chapter(local_28);
      } while (local_28 != pCVar2);
    }
    operator_delete__(&pCVar1->displays_size_);
  }
  *(undefined8 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

Chapters::~Chapters() {
  while (chapters_count_ > 0) {
    Chapter& chapter = chapters_[--chapters_count_];
    chapter.Clear();
  }

  delete[] chapters_;
  chapters_ = NULL;
}